

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSubscribe(HelicsEndpoint endpoint,char *key,HelicsError *err)

{
  Endpoint *this;
  char *pcVar1;
  size_t sVar2;
  string_view key_00;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (key == (char *)0x0 || *(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
LAB_001aa3f2:
    this = *endpoint;
    sVar2 = strlen(key);
    key_00._M_str = key;
    key_00._M_len = sVar2;
    helics::Endpoint::subscribe(this,key_00);
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      pcVar1 = "The given endpoint does not point to a valid object";
    }
    else {
      if (key != (char *)0x0) goto LAB_001aa3f2;
      err->error_code = -4;
      pcVar1 = "The supplied string argument is null and therefore invalid";
    }
    err->message = pcVar1;
  }
  return;
}

Assistant:

void helicsEndpointSubscribe(HelicsEndpoint endpoint, const char* key, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(key, void());
    try {
        endObj->endPtr->subscribe(key);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}